

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_pasv_resp(Curl_easy *data,int ftpcode)

{
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  connectdata *conn;
  ConnectBits CVar4;
  curl_trc_feat *pcVar5;
  bool bVar6;
  proxy_info *ppVar7;
  resolve_t rVar8;
  CURLcode CVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  ip_quadruple *piVar14;
  uint uVar15;
  char **ppcVar16;
  char **ppcVar17;
  bool bVar18;
  Curl_dns_entry *addr;
  char *endp;
  Curl_dns_entry *local_158;
  int local_14c;
  Curl_easy *local_148;
  char **local_140;
  undefined8 local_138;
  uint local_130;
  uint local_12c;
  int local_128;
  short local_124;
  
  conn = data->conn;
  local_158 = (Curl_dns_entry *)0x0;
  pcVar10 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
  ppcVar16 = (char **)(pcVar10 + 4);
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  iVar3 = (conn->proto).ftpc.count1;
  local_14c = ftpcode;
  if (ftpcode == 0xe5 && iVar3 == 0) {
    pcVar10 = strchr((char *)ppcVar16,0x28);
    if (pcVar10 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      cVar2 = pcVar10[1];
      bVar18 = true;
      if (((pcVar10[2] == cVar2) && (pcVar10[3] == cVar2)) && ((byte)(pcVar10[4] - 0x30U) < 10)) {
        ppcVar16 = (char **)&local_138;
        uVar11 = strtoul(pcVar10 + 4,ppcVar16,10);
        if (*(char *)CONCAT44(local_138._4_4_,(uint)local_138) == cVar2) {
          pcVar10 = pcVar10 + 1;
          if (0xffff < uVar11) {
            bVar18 = false;
            Curl_failf(data,"Illegal port number in EPSV reply");
            ppcVar16 = (char **)0xd;
            goto LAB_0012ba51;
          }
        }
        else {
          pcVar10 = (char *)0x0;
        }
        if (pcVar10 != (char *)0x0) {
          (conn->proto).ftpc.newport = (unsigned_short)uVar11;
          if (((ulong)conn->bits & 10) == 0) {
            piVar14 = &conn->primary;
          }
          else {
            piVar14 = (ip_quadruple *)(conn->host).name;
          }
          pcVar13 = (*Curl_cstrdup)(piVar14->remote_ip);
          (conn->proto).ftpc.newhost = pcVar13;
          if (pcVar13 == (char *)0x0) {
            ppcVar16 = (char **)0x1b;
            bVar18 = false;
            goto LAB_0012ba51;
          }
        }
        bVar18 = true;
      }
      else {
        pcVar10 = (char *)0x0;
      }
LAB_0012ba51:
      CVar9 = (CURLcode)ppcVar16;
      if (!bVar18) goto LAB_0012bbc4;
    }
    CVar9 = (CURLcode)ppcVar16;
    bVar18 = true;
    if (pcVar10 == (char *)0x0) {
      bVar18 = false;
      Curl_failf(data,"Weirdly formatted EPSV reply");
      CVar9 = CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (ftpcode != 0xe3 || iVar3 != 1) {
      if (iVar3 == 0) {
        CVar9 = ftp_epsv_disable(data,conn);
        return CVar9;
      }
      Curl_failf(data,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
    local_148 = data;
    if (*(char *)ppcVar16 != '\0') {
      ppcVar17 = ppcVar16;
      do {
        uVar11 = 0;
        bVar18 = false;
        ppcVar16 = ppcVar17;
        do {
          if (uVar11 == 0) {
LAB_0012b9eb:
            if ((9 < (byte)(*(char *)ppcVar16 - 0x30U)) ||
               (uVar12 = strtoul((char *)ppcVar16,(char **)&local_140,10), 0xff < uVar12))
            goto LAB_0012ba0d;
            *(int *)((long)&local_138 + uVar11 * 4) = (int)uVar12;
            bVar6 = true;
            ppcVar16 = local_140;
          }
          else {
            if (*(char *)ppcVar16 == ',') {
              ppcVar16 = (char **)((long)ppcVar16 + 1);
              goto LAB_0012b9eb;
            }
LAB_0012ba0d:
            bVar6 = false;
          }
          if (!bVar6) break;
          bVar18 = 4 < uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar11 != 6);
        ppcVar16 = ppcVar17;
      } while ((!bVar18) &&
              (ppcVar16 = (char **)((long)ppcVar17 + 1), pcVar10 = (char *)((long)ppcVar17 + 1),
              ppcVar17 = ppcVar16, *pcVar10 != '\0'));
    }
    data = local_148;
    CVar9 = (CURLcode)ppcVar16;
    if (*(char *)ppcVar16 == '\0') {
      bVar18 = false;
      Curl_failf(local_148,"Couldn\'t interpret the 227-response");
      CVar9 = CURLE_FTP_WEIRD_227_FORMAT;
      goto LAB_0012bbc6;
    }
    uVar15 = (uint)*(undefined8 *)&(local_148->set).field_0x8ca;
    if ((uVar15 >> 0x10 & 1) == 0) {
      pcVar10 = curl_maprintf("%u.%u.%u.%u",(ulong)(uint)local_138,(ulong)local_138._4_4_,
                              (ulong)local_130,(ulong)local_12c);
    }
    else {
      if (((uVar15 >> 0x1c & 1) != 0 && local_148 != (Curl_easy *)0x0) &&
         ((pcVar5 = (local_148->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
          (0 < pcVar5->log_level)))) {
        Curl_infof(local_148,"Skip %u.%u.%u.%u for data connection, reuse %s instead",
                   (ulong)(uint)local_138,(ulong)local_138._4_4_,(ulong)local_130,(ulong)local_12c,
                   (conn->host).name);
      }
      if (((ulong)conn->bits & 10) == 0) {
        piVar14 = &conn->primary;
      }
      else {
        piVar14 = (ip_quadruple *)(conn->host).name;
      }
      pcVar10 = (*Curl_cstrdup)(piVar14->remote_ip);
    }
    (conn->proto).ftpc.newhost = pcVar10;
    if (pcVar10 != (char *)0x0) {
      (conn->proto).ftpc.newport = (short)(local_128 << 8) + local_124;
      bVar18 = true;
      goto LAB_0012bbc6;
    }
    CVar9 = CURLE_OUT_OF_MEMORY;
LAB_0012bbc4:
    bVar18 = false;
  }
LAB_0012bbc6:
  if (!bVar18) {
    return CVar9;
  }
  CVar4 = conn->bits;
  if (((ulong)CVar4 & 0x10) == 0) {
    if (((CVar4._0_4_ & 0x800040) == 0x800000) &&
       (pcVar10 = (conn->proto).ftpc.newhost, *pcVar10 == '\0')) {
      (*Curl_cfree)(pcVar10);
      (conn->proto).ftpc.newhost = (char *)0x0;
      if (((ulong)conn->bits & 10) == 0) {
        piVar14 = &conn->primary;
      }
      else {
        piVar14 = (ip_quadruple *)(conn->host).name;
      }
      pcVar10 = (*Curl_cstrdup)(piVar14->remote_ip);
      (conn->proto).ftpc.newhost = pcVar10;
      if (pcVar10 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    rVar8 = Curl_resolv(data,(conn->proto).ftpc.newhost,(uint)(conn->proto).ftpc.newport,false,
                        &local_158);
    if (rVar8 == CURLRESOLV_PENDING) {
      Curl_resolver_wait_resolv(data,&local_158);
    }
    uVar15 = (uint)(conn->proto).ftpc.newport;
    if (local_158 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"cannot resolve new host %s:%hu",(conn->proto).ftpc.newhost,(ulong)uVar15);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    ppVar7 = &conn->socks_proxy;
    if (((ulong)CVar4 & 2) == 0) {
      ppVar7 = &conn->http_proxy;
    }
    pcVar10 = (ppVar7->host).name;
    rVar8 = Curl_resolv(data,pcVar10,(conn->primary).remote_port,false,&local_158);
    if (rVar8 == CURLRESOLV_PENDING) {
      Curl_resolver_wait_resolv(data,&local_158);
    }
    uVar15 = (conn->primary).remote_port;
    if (local_158 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"cannot resolve proxy host %s:%hu",pcVar10,(ulong)(uVar15 & 0xffff));
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  CVar9 = Curl_conn_setup(data,conn,1,local_158,*(uint *)&conn->bits >> 0x11 & 1);
  if (CVar9 == CURLE_OK) {
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar10 = (conn->proto).ftpc.newhost;
      Curl_printable_address(local_158->addr,(char *)&local_138,0x100);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"Connecting to %s (%s) port %d",pcVar10,&local_138,(ulong)(uVar15 & 0xffff))
        ;
      }
    }
    Curl_resolv_unlink(data,&local_158);
    (*Curl_cfree)(conn->secondaryhostname);
    conn->secondaryhostname = (char *)0x0;
    conn->secondary_port = (conn->proto).ftpc.newport;
    pcVar10 = (*Curl_cstrdup)((conn->proto).ftpc.newhost);
    conn->secondaryhostname = pcVar10;
    if (pcVar10 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 | 0x10;
    _ftp_state(data,'\0');
    return CURLE_OK;
  }
  Curl_resolv_unlink(data,&local_158);
  if (local_14c != 0xe5) {
    return CVar9;
  }
  if ((conn->proto).ftpc.count1 == 0) {
    CVar9 = ftp_epsv_disable(data,conn);
    return CVar9;
  }
  return CVar9;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_dns_entry *addr = NULL;
  enum resolve_t rc;
  unsigned short connectport; /* the local port connect() should use! */
  struct pingpong *pp = &ftpc->pp;
  char *str =
    Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      char sep;
      ptr++;
      /* |||12345| */
      sep = ptr[0];
      /* the ISDIGIT() check here is because strtoul() accepts leading minus
         etc */
      if((ptr[1] == sep) && (ptr[2] == sep) && ISDIGIT(ptr[3])) {
        char *endp;
        unsigned long num = strtoul(&ptr[3], &endp, 10);
        if(*endp != sep)
          ptr = NULL;
        else if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[6];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(match_pasv_6nums(str, ip))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, reuse %s instead",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((ip[4] << 8) + ip[5]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(data, conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We do not want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    rc = Curl_resolv(data, host_name, conn->primary.remote_port, FALSE, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(data, &addr);

    /* we connect to the proxy's port */
    connectport = (unsigned short)conn->primary.remote_port;

    if(!addr) {
      failf(data, "cannot resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else
#endif
  {
    /* normal, direct, ftp connection */
    DEBUGASSERT(ftpc->newhost);

    /* postponed address resolution in case of tcp fastopen */
    if(conn->bits.tcp_fastopen && !conn->bits.reuse && !ftpc->newhost[0]) {
      Curl_safefree(ftpc->newhost);
      ftpc->newhost = strdup(control_address(conn));
      if(!ftpc->newhost)
        return CURLE_OUT_OF_MEMORY;
    }

    rc = Curl_resolv(data, ftpc->newhost, ftpc->newport, FALSE, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(data, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "cannot resolve new host %s:%hu",
            ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  result = Curl_conn_setup(data, conn, SECONDARYSOCKET, addr,
                           conn->bits.ftp_use_data_ssl ?
                           CURL_CF_SSL_ENABLE : CURL_CF_SSL_DISABLE);

  if(result) {
    Curl_resolv_unlink(data, &addr); /* we are done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(data, conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(data, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlink(data, &addr); /* we are done using this address */

  Curl_safefree(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  ftp_state(data, FTP_STOP); /* this phase is completed */

  return result;
}